

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O3

optional<slang::ast::SequenceRange> __thiscall
slang::ast::SequenceConcatExpr::computeSequenceLengthImpl(SequenceConcatExpr *this)

{
  uint32_t uVar1;
  uint uVar2;
  pointer pEVar3;
  _Optional_base<slang::ast::SequenceRange,_true,_true> _Var4;
  ulong uVar5;
  int iVar6;
  pointer pEVar7;
  uint uVar8;
  undefined4 uStack_54;
  NondegeneracyCheckResult local_50;
  
  uVar5 = 0x100000000;
  if ((this->elements)._M_extent._M_extent_value == 0) {
    iVar6 = 0;
  }
  else {
    pEVar7 = (this->elements)._M_ptr;
    iVar6 = 0;
    uVar8 = 0;
    do {
      AssertionExpr::checkNondegeneracy(&local_50,(pEVar7->sequence).ptr);
      pEVar3 = (this->elements)._M_ptr;
      if ((local_50.status.m_bits & 2) == 0 && pEVar7 == pEVar3) {
        uVar8 = 1;
        iVar6 = 1;
      }
      uVar1 = (pEVar7->delay).min;
      if ((pEVar7->delay).max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_engaged == true) {
        uVar2 = (pEVar7->delay).max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int>._M_payload._M_value;
        uVar8 = (uVar8 + uVar2) - (uint)(uVar2 != 0 & (byte)local_50.status.m_bits >> 1);
      }
      iVar6 = (iVar6 + uVar1) - (uint)((byte)local_50.status.m_bits >> 1 & uVar1 != 0);
      pEVar7 = pEVar7 + 1;
    } while (pEVar7 != pEVar3 + (this->elements)._M_extent._M_extent_value);
    uVar5 = (ulong)uVar8 | 0x100000000;
  }
  uStack_54 = CONCAT31(uStack_54._1_3_,1);
  _Var4._M_payload.super__Optional_payload_base<slang::ast::SequenceRange>._M_payload._M_value.max.
  super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int> = (optional<unsigned_int>)(optional<unsigned_int>)uVar5
  ;
  _Var4._M_payload.super__Optional_payload_base<slang::ast::SequenceRange>._M_payload._M_value.min =
       iVar6;
  _Var4._M_payload.super__Optional_payload_base<slang::ast::SequenceRange>._12_4_ = uStack_54;
  return (_Optional_base<slang::ast::SequenceRange,_true,_true>)
         (_Optional_base<slang::ast::SequenceRange,_true,_true>)
         _Var4._M_payload.super__Optional_payload_base<slang::ast::SequenceRange>;
}

Assistant:

std::optional<SequenceRange> SequenceConcatExpr::computeSequenceLengthImpl() const {
    uint32_t delayMin = 0;
    uint32_t delayMax = 0;
    for (auto it = elements.begin(); it != elements.end(); it++) {
        const bool acceptsOnlyEmpty = it->sequence->checkNondegeneracy().status.has(
            NondegeneracyStatus::AcceptsOnlyEmpty);

        // Default delay length for concat sequence is 1 if it admits a non-empty match.
        if (it == elements.begin() && !acceptsOnlyEmpty)
            delayMin = delayMax = 1;

        // (empty ##n seq), where n is greater than 0, is equivalent to (##(n-1) seq).
        // Also ((##n empty) ; (seq ##n empty)), where n is greater than 0, is equivalent to
        // ((##(n-1) `true) ; (seq ##(n-1) `true))
        delayMin += (it->delay.min && acceptsOnlyEmpty) ? it->delay.min - 1 : it->delay.min;
        if (it->delay.max.has_value()) {
            const auto maxVal = it->delay.max.value();
            delayMax += (maxVal && acceptsOnlyEmpty) ? maxVal - 1 : maxVal;
        }
    }

    SequenceRange res;
    res.min = delayMin;
    res.max = delayMax;
    return res;
}